

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.h
# Opt level: O2

void __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::~Tokenizer
          (Tokenizer<mecab_node_t,_mecab_path_t> *this)

{
  int in_ESI;
  
  this->_vptr_Tokenizer = (_func_int **)&PTR__Tokenizer_0016bb48;
  close(this,in_ESI);
  whatlog::~whatlog(&this->what_);
  CharProperty::~CharProperty(&this->property_);
  std::
  _Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
  ::~_Vector_base(&(this->unk_tokens_).
                   super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 );
  FreeList<mecab_dictionary_info_t>::~FreeList(&this->dictionary_info_freelist_);
  scoped_array<char>::~scoped_array(&(this->unk_feature_).super_scoped_array<char>);
  scoped_array<char>::~scoped_array(&(this->bos_feature_).super_scoped_array<char>);
  Dictionary::~Dictionary(&this->unkdic_);
  std::_Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>::~_Vector_base
            (&(this->dic_).
              super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>);
  return;
}

Assistant:

virtual ~Tokenizer() { this->close(); }